

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<char> * __thiscall
kj::ArrayBuilder<char>::operator=(ArrayBuilder<char> *this,ArrayBuilder<char> *other)

{
  char *pcVar1;
  RemoveConst<char> *pRVar2;
  char *pcVar3;
  
  pcVar1 = this->ptr;
  if (pcVar1 != (char *)0x0) {
    pRVar2 = this->pos;
    pcVar3 = this->endPtr;
    this->ptr = (char *)0x0;
    this->pos = (RemoveConst<char> *)0x0;
    this->endPtr = (char *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pcVar1,1,(long)pRVar2 - (long)pcVar1,(long)pcVar3 - (long)pcVar1,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char *)0x0;
  other->pos = (RemoveConst<char> *)0x0;
  other->endPtr = (char *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }